

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-util.c
# Opt level: O1

int16_t object_weight_one(object *obj)

{
  uint uVar1;
  int16_t iVar2;
  ushort uVar3;
  ulong uVar5;
  uint uVar4;
  
  uVar1._0_2_ = obj->weight;
  uVar1._2_1_ = obj->dd;
  uVar1._3_1_ = obj->ds;
  uVar4 = 0;
  if (0 < (short)(undefined2)uVar1) {
    uVar4 = uVar1;
  }
  iVar2 = (int16_t)uVar4;
  if ((obj->curses != (curse_data *)0x0) && (1 < z_info->curse_max)) {
    uVar5 = 1;
    do {
      if (obj->curses[uVar5].power != L'\0') {
        uVar3 = modify_weight_for_curse((wchar_t)uVar5,(int16_t)uVar4);
        uVar4 = (uint)uVar3;
      }
      iVar2 = (int16_t)uVar4;
      uVar5 = uVar5 + 1;
    } while (uVar5 < z_info->curse_max);
  }
  return iVar2;
}

Assistant:

int16_t object_weight_one(const struct object *obj)
{
	int16_t result = MAX(obj->weight, 0);

	if (obj->curses) {
		int i;

		for (i = 1; i < z_info->curse_max; ++i) {
			if (obj->curses[i].power) {
				result = modify_weight_for_curse(i, result);
			}
		}
	}

	return result;
}